

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.h
# Opt level: O1

osc_bundle_element_size_t osc::ReceivedPacket::ValidateSize(osc_bundle_element_size_t size)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  if ((uint)size < 0x7ffffffd) {
    if (size == 0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
      pcVar2 = "zero length elements not permitted";
    }
    else {
      if ((size & 3U) == 0) {
        return size;
      }
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
      pcVar2 = "element size must be multiple of four";
    }
  }
  else {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    pcVar2 = "invalid packet size";
  }
  puVar1[1] = pcVar2;
  *puVar1 = &PTR__exception_0010cae8;
  __cxa_throw(puVar1,&MalformedPacketException::typeinfo,std::exception::~exception);
}

Assistant:

static osc_bundle_element_size_t ValidateSize( osc_bundle_element_size_t size )
    {
        // sanity check integer types declared in OscTypes.h 
        // you'll need to fix OscTypes.h if any of these asserts fail
        assert( sizeof(osc::int32) == 4 );
        assert( sizeof(osc::uint32) == 4 );
        assert( sizeof(osc::int64) == 8 );
        assert( sizeof(osc::uint64) == 8 );

        if( !IsValidElementSizeValue(size) )
            throw MalformedPacketException( "invalid packet size" );

        if( size == 0 )
            throw MalformedPacketException( "zero length elements not permitted" );

        if( !IsMultipleOf4(size) )
            throw MalformedPacketException( "element size must be multiple of four" );

        return size;
    }